

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_no_value.hpp
# Opt level: O1

void __thiscall
cfgfile::tag_no_value_t<cfgfile::qstring_trait_t>::on_string
          (tag_no_value_t<cfgfile::qstring_trait_t> *this,
          parser_info_t<cfgfile::qstring_trait_t> *info,string_t *str)

{
  char16_t *pcVar1;
  qsizetype qVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  logic_error *this_00;
  storage_type *psVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  qstring_wrapper_t local_228;
  string local_208;
  QArrayData *local_1e8;
  char16_t *local_1e0;
  QArrayData QStack_1d8;
  qstring_wrapper_t local_1c8;
  qstring_wrapper_t local_1b0;
  string local_198;
  string local_178;
  string_t local_158;
  string_t local_140;
  string_t local_128;
  string_t local_110;
  qstring_wrapper_t local_f8;
  qstring_wrapper_t local_e0;
  qstring_wrapper_t local_c8;
  qstring_wrapper_t local_b0;
  qstring_wrapper_t local_98;
  qstring_wrapper_t local_80;
  qstring_wrapper_t local_68;
  char *local_50 [2];
  char local_40 [16];
  
  this_00 = (logic_error *)__cxa_allocate_exception(0x28);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Tag \"","");
  if (local_50[0] == (char *)0x0) {
    psVar5 = (storage_type *)0x0;
  }
  else {
    psVar5 = (storage_type *)strlen(local_50[0]);
  }
  QVar6.m_data = psVar5;
  QVar6.m_size = (qsizetype)&local_1e8;
  QString::fromUtf8(QVar6);
  local_1b0.m_str.d.d = (Data *)local_1e8;
  local_1b0.m_str.d.ptr = local_1e0;
  local_1b0.m_str.d.size._0_4_ = QStack_1d8.ref_._q_value.super___atomic_base<int>._M_i;
  local_1b0.m_str.d.size._4_4_ = QStack_1d8.flags.i;
  if (local_1e8 != (QArrayData *)0x0) {
    LOCK();
    (local_1e8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1e8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (local_1e8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_1e8,2,8);
    }
  }
  operator+(&local_f8,&local_1b0,&(this->super_tag_t<cfgfile::qstring_trait_t>).m_name);
  local_1e8 = &QStack_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e8,"\" doesn\'t allow any values. But we\'ve got this: \"","");
  if (local_1e8 == (QArrayData *)0x0) {
    psVar5 = (storage_type *)0x0;
  }
  else {
    psVar5 = (storage_type *)strlen((char *)local_1e8);
  }
  QVar7.m_data = psVar5;
  QVar7.m_size = (qsizetype)&local_208;
  QString::fromUtf8(QVar7);
  local_1c8.m_str.d.d = (Data *)local_208._M_dataplus._M_p;
  local_1c8.m_str.d.ptr = (char16_t *)local_208._M_string_length;
  local_1c8.m_str.d.size = local_208.field_2._M_allocated_capacity;
  if ((QArrayData *)local_208._M_dataplus._M_p != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_208._M_dataplus._M_p = *(int *)local_208._M_dataplus._M_p + 1;
    UNLOCK();
    LOCK();
    *(int *)local_208._M_dataplus._M_p = *(int *)local_208._M_dataplus._M_p + -1;
    UNLOCK();
    if (*(int *)local_208._M_dataplus._M_p == 0) {
      QArrayData::deallocate((QArrayData *)local_208._M_dataplus._M_p,2,8);
    }
  }
  operator+(&local_e0,&local_f8,&local_1c8);
  operator+(&local_c8,&local_e0,str);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"\". In file \"","");
  qstring_trait_t::from_ascii(&local_110,&local_208);
  operator+(&local_b0,&local_c8,&local_110);
  operator+(&local_98,&local_b0,&info->m_file_name);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"\" on line ","");
  qstring_trait_t::from_ascii(&local_128,&local_178);
  operator+(&local_80,&local_98,&local_128);
  qstring_trait_t::to_string(&local_140,info->m_line_number);
  operator+(&local_68,&local_80,&local_140);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,".","");
  qstring_trait_t::from_ascii(&local_158,&local_198);
  operator+(&local_228,&local_68,&local_158);
  std::logic_error::logic_error(this_00,"Please use desc() method of the exception.");
  *(undefined ***)this_00 = &PTR__exception_t_00131c80;
  *(undefined8 *)(this_00 + 0x10) = 0;
  *(undefined8 *)(this_00 + 0x18) = 0;
  *(undefined8 *)(this_00 + 0x20) = 0;
  pcVar1 = *(char16_t **)(this_00 + 0x18);
  uVar3 = local_228.m_str.d.d._0_4_;
  uVar4 = local_228.m_str.d.d._4_4_;
  local_228.m_str.d.d = (Data *)0x0;
  *(undefined4 *)(this_00 + 0x10) = uVar3;
  *(undefined4 *)(this_00 + 0x14) = uVar4;
  *(undefined4 *)(this_00 + 0x18) = local_228.m_str.d.ptr._0_4_;
  *(undefined4 *)(this_00 + 0x1c) = local_228.m_str.d.ptr._4_4_;
  qVar2 = *(qsizetype *)(this_00 + 0x20);
  *(qsizetype *)(this_00 + 0x20) = local_228.m_str.d.size;
  local_228.m_str.d.ptr = pcVar1;
  local_228.m_str.d.size = qVar2;
  __cxa_throw(this_00,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
              exception_t<cfgfile::qstring_trait_t>::~exception_t);
}

Assistant:

void on_string( const parser_info_t< Trait > & info,
		const typename Trait::string_t & str ) override
	{
		throw exception_t< Trait >( Trait::from_ascii( "Tag \"" ) +
			this->name() + Trait::from_ascii( "\" doesn't allow any values. "
				"But we've got this: \"" ) +
			str + Trait::from_ascii( "\". In file \"" ) + info.file_name() +
			Trait::from_ascii( "\" on line " ) +
			Trait::to_string( info.line_number() ) +
			Trait::from_ascii( "." ) );
	}